

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

void miIntersectO(QRegionPrivate *dest,QRect *r1,QRect *r1End,QRect *r2,QRect *r2End,int y1,int y2)

{
  int iVar1;
  long lVar2;
  int iVar3;
  pointer pQVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  QList<QRect> *this;
  int iVar8;
  
  this = &dest->rects;
  pQVar4 = QList<QRect>::data(this);
  uVar6 = (ulong)dest->numRects;
  pQVar4 = pQVar4 + uVar6;
  while ((iVar5 = (int)uVar6, r1 != r1End && (r2 != r2End))) {
    iVar8 = (r1->x1).m_i;
    iVar3 = (r1->x2).m_i;
    iVar1 = (r2->x1).m_i;
    iVar7 = (r2->x2).m_i;
    if (iVar1 < iVar8) {
      iVar1 = iVar8;
    }
    iVar8 = iVar7;
    if (iVar3 < iVar7) {
      iVar8 = iVar3;
    }
    if (iVar1 <= iVar8) {
      lVar2 = (dest->rects).d.size;
      if (lVar2 + -1 <= (long)iVar5) {
        QList<QRect>::resize(this,lVar2 * 2);
        pQVar4 = QList<QRect>::data(this);
        iVar5 = dest->numRects;
        pQVar4 = pQVar4 + iVar5;
      }
      (pQVar4->x1).m_i = iVar1;
      (pQVar4->y1).m_i = y1;
      (pQVar4->x2).m_i = iVar8;
      (pQVar4->y2).m_i = y2;
      uVar6 = (ulong)(iVar5 + 1U);
      dest->numRects = iVar5 + 1U;
      pQVar4 = pQVar4 + 1;
      iVar3 = (r1->x2).m_i;
      iVar7 = (r2->x2).m_i;
    }
    if (iVar3 < iVar7) {
      r1 = r1 + 1;
    }
    else {
      if (iVar3 <= iVar7) {
        r1 = r1 + 1;
      }
      r2 = r2 + 1;
    }
  }
  return;
}

Assistant:

static void miIntersectO(QRegionPrivate &dest, const QRect *r1, const QRect *r1End,
                         const QRect *r2, const QRect *r2End, int y1, int y2)
{
    int x1;
    int x2;
    QRect *pNextRect;

    pNextRect = dest.rects.data() + dest.numRects;

    while (r1 != r1End && r2 != r2End) {
        x1 = qMax(r1->left(), r2->left());
        x2 = qMin(r1->right(), r2->right());

        /*
         * If there's any overlap between the two rectangles, add that
         * overlap to the new region.
         * There's no need to check for subsumption because the only way
         * such a need could arise is if some region has two rectangles
         * right next to each other. Since that should never happen...
         */
        if (x1 <= x2) {
            Q_ASSERT(y1 <= y2);
            MEMCHECK(dest, pNextRect, dest.rects)
            pNextRect->setCoords(x1, y1, x2, y2);
            ++dest.numRects;
            ++pNextRect;
        }

        /*
         * Need to advance the pointers. Shift the one that extends
         * to the right the least, since the other still has a chance to
         * overlap with that region's next rectangle, if you see what I mean.
         */
        if (r1->right() < r2->right()) {
            ++r1;
        } else if (r2->right() < r1->right()) {
            ++r2;
        } else {
            ++r1;
            ++r2;
        }
    }
}